

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.h
# Opt level: O0

void __thiscall asl::TextFile::TextFile(TextFile *this,String *name,OpenMode mode)

{
  OpenMode mode_local;
  String *name_local;
  TextFile *this_local;
  
  File::File(&this->super_File);
  open(this,(char *)name,mode);
  return;
}

Assistant:

ASL_EXPLICIT TextFile(const String& name, OpenMode mode) { open(name, mode); }